

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O1

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::ItemFromIndex
          (ON_ComponentManifest *this,Type component_type,int manifest_item_index)

{
  ON_ComponentManifestItem *pOVar1;
  
  if (this->m_impl == (ON_ComponentManifestImpl *)0x0) {
    pOVar1 = (ON_ComponentManifestItem *)0x0;
  }
  else {
    pOVar1 = &ON_ComponentManifestImpl::ItemFromManifestIndex
                        (this->m_impl,component_type,manifest_item_index)->
              super_ON_ComponentManifestItem;
  }
  if ((ON_ComponentManifestItem_PRIVATE *)pOVar1 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar1 = &ON_ComponentManifestItem::UnsetItem;
  }
  return pOVar1;
}

Assistant:

const class ON_ComponentManifestItem& ON_ComponentManifest::ItemFromIndex(
  ON_ModelComponent::Type component_type,
  int manifest_item_index
  ) const
{
  const ON_ComponentManifestItem_PRIVATE* item
    = (nullptr != m_impl)
    ? m_impl->ItemFromManifestIndex(component_type,manifest_item_index)
    : nullptr;
  return
    (nullptr != item )
    ? *item
    : ON_ComponentManifestItem::UnsetItem;
}